

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void show_obj_list(olist_detail_t mode)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  wchar_t col;
  wchar_t row;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  char *pcVar7;
  int iVar8;
  olist_detail_t mode_00;
  uint uVar9;
  ulong uVar10;
  char tmp_val [80];
  
  max_len = 0;
  ex_width = L'\0';
  ex_offset = L'\0';
  if ((mode & OLIST_WINDOW) == OLIST_NONE) {
    iVar3 = Term->wid;
    mode_00 = mode;
  }
  else {
    max_len = 0x28;
    iVar3 = Term->wid;
    mode_00 = mode & ~OLIST_WEIGHT;
    if (0x27 < iVar3) {
      mode_00 = mode;
    }
  }
  set_obj_names(iVar3 < 0x32,player);
  sVar2 = max_len;
  if ((((mode_00 & OLIST_QUIVER) != OLIST_NONE) && (*player->upkeep->quiver != (object *)0x0)) &&
     (sVar2 = 0x18, 0x18 < max_len)) {
    sVar2 = max_len;
  }
  max_len = sVar2;
  if ((mode_00 & OLIST_WEIGHT) != OLIST_NONE) {
    ex_width = ex_width + L'\t';
  }
  if ((mode_00 & OLIST_PRICE) != OLIST_NONE) {
    ex_width = ex_width + L'\t';
  }
  if ((mode_00 & OLIST_FAIL) != OLIST_NONE) {
    ex_width = ex_width + L'\n';
  }
  col = L'\0';
  wVar4 = L'\0';
  if ((mode & OLIST_WINDOW) == OLIST_NONE) {
    wVar4 = ~(ex_width + (wchar_t)max_len) + Term->wid;
    col = L'\0';
    if (L'\x02' < wVar4) {
      col = wVar4;
    }
    wVar4 = L'\x01';
  }
  ex_offset = (Term->wid - col) + ~ex_width;
  if (max_len <= (ulong)(long)ex_offset) {
    ex_offset = (wchar_t)max_len;
  }
  for (uVar10 = 0; (wchar_t)uVar10 < num_obj; uVar10 = uVar10 + 1) {
    show_obj((wchar_t)uVar10,wVar4,col,false,mode_00);
  }
  if ((mode_00 & OLIST_QUIVER) != OLIST_NONE) {
    iVar3 = (player->upkeep->quiver_cnt + (uint)z_info->quiver_slot_size + -1) /
            (int)(uint)z_info->quiver_slot_size;
    iVar5 = iVar3 + -1;
    wVar6 = L'\x02';
    if (L'\x02' < col) {
      wVar6 = col;
    }
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (iVar8 = 0; iVar3 != iVar8; iVar8 = iVar8 + 1) {
      if (iVar5 == iVar8) {
        uVar9 = player->upkeep->quiver_cnt - (uint)z_info->quiver_slot_size * iVar5;
      }
      else {
        uVar9 = (uint)z_info->quiver_slot_size;
      }
      cVar1 = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar10 - (mode & OLIST_WINDOW)];
      row = wVar4 + (int)uVar10;
      prt("",row,wVar6 + L'\xfffffffe');
      strnfmt(tmp_val,0x50,"%c) ",(ulong)(uint)(int)cVar1);
      c_put_str('\x02',tmp_val,row,col);
      pcVar7 = "s";
      if (uVar9 == 1) {
        pcVar7 = "";
      }
      strnfmt(tmp_val,0x50,"in Quiver: %d missile%s",(ulong)uVar9,pcVar7);
      c_put_str('\x0f',tmp_val,row,col + L'\x03');
      uVar10 = uVar10 + 1;
    }
  }
  if ((mode & OLIST_WINDOW) == OLIST_NONE) {
    if ((0 < (int)uVar10) && (wVar4 = (int)uVar10 + wVar4, wVar4 < L'\x18')) {
      wVar6 = L'\x02';
      if (L'\x02' < col) {
        wVar6 = col;
      }
      prt("",wVar4,wVar6 + L'\xfffffffe');
    }
  }
  else {
    wVar6 = L'\x02';
    if (L'\x02' < col) {
      wVar6 = col;
    }
    while (iVar3 = (int)uVar10, iVar3 < Term->hgt) {
      prt("",wVar4 + iVar3,wVar6 + L'\xfffffffe');
      uVar10 = (ulong)(iVar3 + 1);
    }
  }
  return;
}

Assistant:

static void show_obj_list(olist_detail_t mode)
{
	int i, row = 0, col = 0;
	char tmp_val[80];

	bool in_term = (mode & OLIST_WINDOW) ? true : false;
	bool terse = false;

	/* Initialize */
	max_len = 0;
	ex_width = 0;
	ex_offset = 0;

	if (in_term) max_len = 40;
	if (in_term && Term->wid < 40) mode &= ~(OLIST_WEIGHT);

	if (Term->wid < 50) terse = true;

	/* Set the names and get the max length */
	set_obj_names(terse, player);

	/* Take the quiver message into consideration */
	if (mode & OLIST_QUIVER && player->upkeep->quiver[0] != NULL)
		max_len = MAX(max_len, 24);

	/* Width of extra fields */
	if (mode & OLIST_WEIGHT) ex_width += 9;
	if (mode & OLIST_PRICE) ex_width += 9;
	if (mode & OLIST_FAIL) ex_width += 10;

	/* Determine beginning row and column */
	if (in_term) {
		/* Term window */
		row = 0;
		col = 0;
	} else {
		/* Main window */
		row = 1;
		col = Term->wid - 1 - max_len - ex_width;

		if (col < 3) col = 0;
	}

	/* Column offset of the first extra field */
	ex_offset = MIN(max_len, (size_t)(Term->wid - 1 - ex_width - col));

	/* Output the list */
	for (i = 0; i < num_obj; i++)
		show_obj(i, row, col, false, mode);

	/* For the inventory: print the quiver count */
	if (mode & OLIST_QUIVER) {
		int count, j;
		int quiver_slots = (player->upkeep->quiver_cnt + z_info->quiver_slot_size - 1) / z_info->quiver_slot_size;

		/* Quiver may take multiple lines */
		for (j = 0; j < quiver_slots; j++, i++) {
			const char *fmt = "in Quiver: %d missile%s";
			char letter = all_letters_nohjkl[in_term ? i - 1 : i];

			/* Number of missiles in this "slot" */
			if (j == quiver_slots - 1)
				count = player->upkeep->quiver_cnt - (z_info->quiver_slot_size * (quiver_slots - 1));
			else
				count = z_info->quiver_slot_size;

			/* Clear the line */
			prt("", row + i, MAX(col - 2, 0));

			/* Print the (disabled) label */
			strnfmt(tmp_val, sizeof(tmp_val), "%c) ", letter);
			c_put_str(COLOUR_SLATE, tmp_val, row + i, col);

			/* Print the count */
			strnfmt(tmp_val, sizeof(tmp_val), fmt, count,
					count == 1 ? "" : "s");
			c_put_str(COLOUR_L_UMBER, tmp_val, row + i, col + 3);
		}
	}

	/* Clear term windows */
	if (in_term) {
		for (; i < Term->hgt; i++)
			prt("", row + i, MAX(col - 2, 0));
	} else if (i > 0 && row + i < 24) {
		/* Print a drop shadow for the main window if necessary */
		prt("", row + i, MAX(col - 2, 0));
	}
}